

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char cVar4;
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar6;
  string __str;
  string __str_1;
  long *local_70;
  uint local_68;
  long local_60 [2];
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  uVar6 = *(long *)&(this->super_exception).m + 1;
  cVar4 = '\x01';
  cVar5 = '\x01';
  if (9 < uVar6) {
    uVar3 = uVar6;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (uVar3 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_001147fa;
      }
      if (uVar3 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_001147fa;
      }
      if (uVar3 < 10000) goto LAB_001147fa;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_001147fa:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
  inja::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar6);
  uVar6 = *(ulong *)&(this->super_exception).id;
  if (9 < uVar6) {
    uVar3 = uVar6;
    cVar5 = '\x04';
    do {
      cVar4 = cVar5;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00114874;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00114874;
      }
      if (uVar3 < 10000) goto LAB_00114874;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar5 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00114874:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
  inja::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,uVar6);
  concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[10],std::__cxx11::string>
            (__return_storage_ptr__,(detail *)" at line ",(char (*) [10])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", column ",
             (char (*) [10])&local_50,in_R9);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return concat(" at line ", std::to_string(pos.lines_read + 1),
                      ", column ", std::to_string(pos.chars_read_current_line));
    }